

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qcombobox.cpp
# Opt level: O2

void QComboBox::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  QSize QVar1;
  QSize QVar2;
  bool bVar3;
  byte bVar4;
  int iVar5;
  QSize QVar6;
  QSize *pQVar7;
  long in_FS_OFFSET;
  anon_union_24_3_e3d07ef4_for_data local_38;
  undefined1 *puStack_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  switch(_c) {
  case InvokeMetaMethod:
    switch(_id) {
    case 0:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        editTextChanged((QComboBox *)_o,(QString *)_a[1]);
        return;
      }
      break;
    case 1:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        activated((QComboBox *)_o,*_a[1]);
        return;
      }
      break;
    case 2:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        textActivated((QComboBox *)_o,(QString *)_a[1]);
        return;
      }
      break;
    case 3:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        highlighted((QComboBox *)_o,*_a[1]);
        return;
      }
      break;
    case 4:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        textHighlighted((QComboBox *)_o,(QString *)_a[1]);
        return;
      }
      break;
    case 5:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        currentIndexChanged((QComboBox *)_o,*_a[1]);
        return;
      }
      break;
    case 6:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        currentTextChanged((QComboBox *)_o,(QString *)_a[1]);
        return;
      }
      break;
    case 7:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        clear((QComboBox *)_o);
        return;
      }
      break;
    case 8:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        clearEditText((QComboBox *)_o);
        return;
      }
      break;
    case 9:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        setEditText((QComboBox *)_o,(QString *)_a[1]);
        return;
      }
      break;
    case 10:
      iVar5 = *_a[1];
LAB_003b6063:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        setCurrentIndex((QComboBox *)_o,iVar5);
        return;
      }
      break;
    case 0xb:
      pQVar7 = (QSize *)_a[1];
switchD_003b5c78_caseD_2:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        setCurrentText((QComboBox *)_o,(QString *)pQVar7);
        return;
      }
      break;
    case 0xc:
      local_38._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
      puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
      local_38.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
      local_38._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      inputMethodQuery((QVariant *)&local_38,(QComboBox *)_o,*_a[1],(QVariant *)_a[2]);
      if ((QVariant *)*_a != (QVariant *)0x0) {
        ::QVariant::operator=((QVariant *)*_a,(QVariant *)&local_38);
      }
LAB_003b6156:
      ::QVariant::~QVariant((QVariant *)&local_38);
    default:
      goto switchD_003b5c16_caseD_3;
    }
    goto LAB_003b6245;
  case ReadProperty:
    if (0xf < (uint)_id) goto switchD_003b5c16_caseD_3;
    break;
  case WriteProperty:
    if (0xf < (uint)_id) goto switchD_003b5c16_caseD_3;
    pQVar7 = (QSize *)*_a;
    switch(_id) {
    case 0:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        setEditable((QComboBox *)_o,SUB41((pQVar7->wd).m_i,0));
        return;
      }
      break;
    default:
      goto switchD_003b5c16_caseD_3;
    case 2:
      goto switchD_003b5c78_caseD_2;
    case 3:
      iVar5 = (pQVar7->wd).m_i;
      goto LAB_003b6063;
    case 5:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        setMaxVisibleItems((QComboBox *)_o,(pQVar7->wd).m_i);
        return;
      }
      break;
    case 6:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        setMaxCount((QComboBox *)_o,(pQVar7->wd).m_i);
        return;
      }
      break;
    case 7:
      *(int *)(*(long *)(_o + 8) + 800) = (pQVar7->wd).m_i;
      goto switchD_003b5c16_caseD_3;
    case 8:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        setSizeAdjustPolicy((QComboBox *)_o,(pQVar7->wd).m_i);
        return;
      }
      break;
    case 9:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        setMinimumContentsLength((QComboBox *)_o,(pQVar7->wd).m_i);
        return;
      }
      break;
    case 10:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        setIconSize((QComboBox *)_o,pQVar7);
        return;
      }
      break;
    case 0xb:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        setPlaceholderText((QComboBox *)_o,(QString *)pQVar7);
        return;
      }
      break;
    case 0xc:
      *(byte *)(*(long *)(_o + 8) + 0x34c) =
           *(byte *)(*(long *)(_o + 8) + 0x34c) & 0xfd | (char)(pQVar7->wd).m_i * '\x02';
      goto switchD_003b5c16_caseD_3;
    case 0xd:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        setFrame((QComboBox *)_o,SUB41((pQVar7->wd).m_i,0));
        return;
      }
      break;
    case 0xe:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        setModelColumn((QComboBox *)_o,(pQVar7->wd).m_i);
        return;
      }
      break;
    case 0xf:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        setLabelDrawingMode((QComboBox *)_o,(pQVar7->wd).m_i);
        return;
      }
    }
    goto LAB_003b6245;
  default:
    goto switchD_003b5c16_caseD_3;
  case IndexOfMethod:
    bVar3 = QtMocHelpers::indexOfMethod<void(QComboBox::*)(QString_const&)>
                      ((QtMocHelpers *)_a,(void **)editTextChanged,0,0);
    if ((((!bVar3) &&
         (bVar3 = QtMocHelpers::indexOfMethod<void(QComboBox::*)(int)>
                            ((QtMocHelpers *)_a,(void **)activated,0,1), !bVar3)) &&
        (bVar3 = QtMocHelpers::indexOfMethod<void(QComboBox::*)(QString_const&)>
                           ((QtMocHelpers *)_a,(void **)textActivated,0,2), !bVar3)) &&
       (((bVar3 = QtMocHelpers::indexOfMethod<void(QComboBox::*)(int)>
                            ((QtMocHelpers *)_a,(void **)highlighted,0,3), !bVar3 &&
         (bVar3 = QtMocHelpers::indexOfMethod<void(QComboBox::*)(QString_const&)>
                            ((QtMocHelpers *)_a,(void **)textHighlighted,0,4), !bVar3)) &&
        (bVar3 = QtMocHelpers::indexOfMethod<void(QComboBox::*)(int)>
                           ((QtMocHelpers *)_a,(void **)currentIndexChanged,0,5), !bVar3)))) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        QtMocHelpers::indexOfMethod<void(QComboBox::*)(QString_const&)>
                  ((QtMocHelpers *)_a,(void **)currentTextChanged,0,6);
        return;
      }
      goto LAB_003b6245;
    }
    goto switchD_003b5c16_caseD_3;
  }
  pQVar7 = (QSize *)*_a;
  switch(_id) {
  case 0:
    (((Private *)&pQVar7->wd)->data).data[0] = *(long *)(*(long *)(_o + 8) + 0x2a0) != 0;
    goto switchD_003b5c16_caseD_3;
  case 1:
    iVar5 = count((QComboBox *)_o);
    break;
  case 2:
    currentText((QString *)&local_38,(QComboBox *)_o);
    goto LAB_003b618e;
  case 3:
    iVar5 = currentIndex((QComboBox *)_o);
    break;
  case 4:
    currentData((QVariant *)&local_38,(QComboBox *)_o,0x100);
    ::QVariant::operator=((QVariant *)pQVar7,(QVariant *)&local_38);
    goto LAB_003b6156;
  case 5:
    iVar5 = *(int *)(*(long *)(_o + 8) + 0x33c);
    break;
  case 6:
    iVar5 = *(int *)(*(long *)(_o + 8) + 0x340);
    break;
  case 7:
    iVar5 = *(int *)(*(long *)(_o + 8) + 800);
    break;
  case 8:
    iVar5 = *(int *)(*(long *)(_o + 8) + 0x324);
    break;
  case 9:
    iVar5 = *(int *)(*(long *)(_o + 8) + 0x334);
    break;
  case 10:
    QVar6 = iconSize((QComboBox *)_o);
    *pQVar7 = QVar6;
    goto switchD_003b5c16_caseD_3;
  case 0xb:
    placeholderText((QString *)&local_38,(QComboBox *)_o);
LAB_003b618e:
    QVar1 = *pQVar7;
    QVar2 = pQVar7[1];
    *pQVar7 = (QSize)local_38.shared;
    pQVar7[1].wd = (Representation)local_38._8_4_;
    pQVar7[1].ht = (Representation)local_38._12_4_;
    QVar6 = pQVar7[2];
    pQVar7[2].wd = (Representation)local_38._16_4_;
    pQVar7[2].ht = (Representation)local_38._20_4_;
    local_38.shared = (PrivateShared *)QVar1;
    local_38._8_8_ = QVar2;
    local_38._16_8_ = QVar6;
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_38);
    goto switchD_003b5c16_caseD_3;
  case 0xc:
    bVar4 = *(byte *)(*(long *)(_o + 8) + 0x34c) >> 1;
    goto LAB_003b6202;
  case 0xd:
    bVar4 = *(byte *)(*(long *)(_o + 8) + 0x34c) >> 2;
LAB_003b6202:
    (((Private *)&pQVar7->wd)->data).data[0] = bVar4 & 1;
    goto switchD_003b5c16_caseD_3;
  case 0xe:
    iVar5 = *(int *)(*(long *)(_o + 8) + 0x344);
    break;
  case 0xf:
    iVar5 = *(int *)(*(long *)(_o + 8) + 0x330);
  }
  *(int *)&((Private *)&pQVar7->wd)->data = iVar5;
switchD_003b5c16_caseD_3:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
LAB_003b6245:
  __stack_chk_fail();
}

Assistant:

void QComboBox::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QComboBox *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->editTextChanged((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 1: _t->activated((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 2: _t->textActivated((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 3: _t->highlighted((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 4: _t->textHighlighted((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 5: _t->currentIndexChanged((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 6: _t->currentTextChanged((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 7: _t->clear(); break;
        case 8: _t->clearEditText(); break;
        case 9: _t->setEditText((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 10: _t->setCurrentIndex((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 11: _t->setCurrentText((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 12: { QVariant _r = _t->inputMethodQuery((*reinterpret_cast< std::add_pointer_t<Qt::InputMethodQuery>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QVariant>>(_a[2])));
            if (_a[0]) *reinterpret_cast< QVariant*>(_a[0]) = std::move(_r); }  break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QComboBox::*)(const QString & )>(_a, &QComboBox::editTextChanged, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QComboBox::*)(int )>(_a, &QComboBox::activated, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QComboBox::*)(const QString & )>(_a, &QComboBox::textActivated, 2))
            return;
        if (QtMocHelpers::indexOfMethod<void (QComboBox::*)(int )>(_a, &QComboBox::highlighted, 3))
            return;
        if (QtMocHelpers::indexOfMethod<void (QComboBox::*)(const QString & )>(_a, &QComboBox::textHighlighted, 4))
            return;
        if (QtMocHelpers::indexOfMethod<void (QComboBox::*)(int )>(_a, &QComboBox::currentIndexChanged, 5))
            return;
        if (QtMocHelpers::indexOfMethod<void (QComboBox::*)(const QString & )>(_a, &QComboBox::currentTextChanged, 6))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<bool*>(_v) = _t->isEditable(); break;
        case 1: *reinterpret_cast<int*>(_v) = _t->count(); break;
        case 2: *reinterpret_cast<QString*>(_v) = _t->currentText(); break;
        case 3: *reinterpret_cast<int*>(_v) = _t->currentIndex(); break;
        case 4: *reinterpret_cast<QVariant*>(_v) = _t->currentData(); break;
        case 5: *reinterpret_cast<int*>(_v) = _t->maxVisibleItems(); break;
        case 6: *reinterpret_cast<int*>(_v) = _t->maxCount(); break;
        case 7: *reinterpret_cast<InsertPolicy*>(_v) = _t->insertPolicy(); break;
        case 8: *reinterpret_cast<SizeAdjustPolicy*>(_v) = _t->sizeAdjustPolicy(); break;
        case 9: *reinterpret_cast<int*>(_v) = _t->minimumContentsLength(); break;
        case 10: *reinterpret_cast<QSize*>(_v) = _t->iconSize(); break;
        case 11: *reinterpret_cast<QString*>(_v) = _t->placeholderText(); break;
        case 12: *reinterpret_cast<bool*>(_v) = _t->duplicatesEnabled(); break;
        case 13: *reinterpret_cast<bool*>(_v) = _t->hasFrame(); break;
        case 14: *reinterpret_cast<int*>(_v) = _t->modelColumn(); break;
        case 15: *reinterpret_cast<LabelDrawingMode*>(_v) = _t->labelDrawingMode(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setEditable(*reinterpret_cast<bool*>(_v)); break;
        case 2: _t->setCurrentText(*reinterpret_cast<QString*>(_v)); break;
        case 3: _t->setCurrentIndex(*reinterpret_cast<int*>(_v)); break;
        case 5: _t->setMaxVisibleItems(*reinterpret_cast<int*>(_v)); break;
        case 6: _t->setMaxCount(*reinterpret_cast<int*>(_v)); break;
        case 7: _t->setInsertPolicy(*reinterpret_cast<InsertPolicy*>(_v)); break;
        case 8: _t->setSizeAdjustPolicy(*reinterpret_cast<SizeAdjustPolicy*>(_v)); break;
        case 9: _t->setMinimumContentsLength(*reinterpret_cast<int*>(_v)); break;
        case 10: _t->setIconSize(*reinterpret_cast<QSize*>(_v)); break;
        case 11: _t->setPlaceholderText(*reinterpret_cast<QString*>(_v)); break;
        case 12: _t->setDuplicatesEnabled(*reinterpret_cast<bool*>(_v)); break;
        case 13: _t->setFrame(*reinterpret_cast<bool*>(_v)); break;
        case 14: _t->setModelColumn(*reinterpret_cast<int*>(_v)); break;
        case 15: _t->setLabelDrawingMode(*reinterpret_cast<LabelDrawingMode*>(_v)); break;
        default: break;
        }
    }
}